

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_search_tree_kernel_1.h
# Opt level: O2

bool __thiscall
dlib::
binary_search_tree_kernel_1<unsigned_long,_std::unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<unsigned_long>_>
::keep_node_balanced
          (binary_search_tree_kernel_1<unsigned_long,_std::unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<unsigned_long>_>
           *this,node **t)

{
  char cVar1;
  node *pnVar2;
  
  pnVar2 = *t;
  cVar1 = pnVar2->balance;
  if (cVar1 != '\0') {
    if (cVar1 == -2) {
      if (pnVar2->left->balance < '\x01') {
        rotate_right(this,t);
      }
      else {
        double_rotate_right(this,t);
      }
    }
    else if (cVar1 == '\x02') {
      if (pnVar2->right->balance < '\0') {
        double_rotate_left(this,t);
      }
      else {
        rotate_left(this,t);
      }
    }
    return (*t)->balance == '\0';
  }
  return false;
}

Assistant:

bool binary_search_tree_kernel_1<domain,range,mem_manager,compare>::
    keep_node_balanced (
        node*& t
    )
    {
        // make a reference to the current node so we don't have to dereference 
        // a pointer a bunch of times
        node& tree = *t;
 
        // if tree does not need to be balanced then return false
        if (tree.balance == 0)
            return false;


        // if tree needs to be rotated left
        if (tree.balance == 2)
        {
            if (tree.right->balance >= 0)
                rotate_left(t);
            else
                double_rotate_left(t);
        }
        // else if the tree needs to be rotated right
        else if (tree.balance == -2)
        {
            if (tree.left->balance <= 0)
                rotate_right(t);
            else
                double_rotate_right(t);
        }
   

        if (t->balance == 0)
            return true;
        else
            return false; 
    }